

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  string_view sVar1;
  bool bVar2;
  char cVar3;
  string *psVar4;
  reference name;
  ostream *poVar5;
  mapped_type *this_00;
  string local_440 [32];
  undefined1 local_420 [8];
  ostringstream e_1;
  undefined1 local_2a8 [8];
  string evaluatedValue;
  cmValue propertyValue;
  undefined1 local_260 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prop;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue exportProperties;
  cmPropertyMap *targetProperties;
  string *errorMessage_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *gte_local;
  cmExportFileGenerator *this_local;
  
  psVar4 = (string *)cmTarget::GetProperties(gte->Target);
  exportProperties.Value = psVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EXPORT_PROPERTIES",&local_61);
  local_40 = cmPropertyMap::GetPropertyValue((cmPropertyMap *)psVar4,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar2 = cmValue::operator_cast_to_bool(&local_40);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_40);
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    cmExpandedList_abi_cxx11_(&local_98,sVar1,false);
    local_80 = &local_98;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_80);
    local_b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_80);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_b8), bVar2) {
      name = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
      bVar2 = cmHasLiteralPrefix<10ul>(sVar1,(char (*) [10])"IMPORTED_");
      if (bVar2) {
LAB_0078454a:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
        poVar5 = std::operator<<((ostream *)local_260,"Target \"");
        psVar4 = cmTarget::GetName_abi_cxx11_(gte->Target);
        poVar5 = std::operator<<(poVar5,(string *)psVar4);
        poVar5 = std::operator<<(poVar5,"\" contains property \"");
        poVar5 = std::operator<<(poVar5,(string *)name);
        poVar5 = std::operator<<(poVar5,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ");
        std::operator<<(poVar5,"properties are reserved.");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)errorMessage,(string *)&propertyValue);
        std::__cxx11::string::~string((string *)&propertyValue);
        this_local._7_1_ = 0;
        cVar3 = '\x01';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
        goto LAB_007848cd;
      }
      sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
      bVar2 = cmHasLiteralPrefix<11ul>(sVar1,(char (*) [11])0xd64b2c);
      if (bVar2) goto LAB_0078454a;
      evaluatedValue.field_2._8_8_ =
           cmPropertyMap::GetPropertyValue((cmPropertyMap *)exportProperties.Value,name);
      bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&evaluatedValue.field_2 + 8));
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&evaluatedValue.field_2 + 8));
        cmGeneratorExpression::Preprocess
                  ((string *)local_2a8,psVar4,StripAllGeneratorExpressions,false);
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&evaluatedValue.field_2 + 8));
        cVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2a8,psVar4);
        if ((bool)cVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
          poVar5 = std::operator<<((ostream *)local_420,"Target \"");
          psVar4 = cmTarget::GetName_abi_cxx11_(gte->Target);
          poVar5 = std::operator<<(poVar5,(string *)psVar4);
          poVar5 = std::operator<<(poVar5,"\" contains property \"");
          poVar5 = std::operator<<(poVar5,(string *)name);
          poVar5 = std::operator<<(poVar5,"\" in EXPORT_PROPERTIES but this property contains a ");
          std::operator<<(poVar5,"generator expression. This is not allowed.");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)errorMessage,local_440);
          std::__cxx11::string::~string(local_440);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
        }
        else {
          psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&evaluatedValue.field_2 + 8));
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](properties,name);
          std::__cxx11::string::operator=((string *)this_00,(string *)psVar4);
        }
        std::__cxx11::string::~string((string *)local_2a8);
        if ((bool)cVar3) goto LAB_007848cd;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cVar3 = '\x02';
LAB_007848cd:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    if (cVar3 == '\x01') goto LAB_007848fc;
  }
  this_local._7_1_ = 1;
LAB_007848fc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  const auto& targetProperties = gte->Target->GetProperties();
  if (cmValue exportProperties =
        targetProperties.GetPropertyValue("EXPORT_PROPERTIES")) {
    for (auto& prop : cmExpandedList(*exportProperties)) {
      /* Black list reserved properties */
      if (cmHasLiteralPrefix(prop, "IMPORTED_") ||
          cmHasLiteralPrefix(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      cmValue propertyValue = targetProperties.GetPropertyValue(prop);
      if (!propertyValue) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        *propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != *propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = *propertyValue;
    }
  }
  return true;
}